

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobjectdefs.h
# Opt level: O0

R_conflict2 * QtPrivate::invokeMethodHelper<bool>(QMetaMethodReturnArgument r,bool *arguments)

{
  long lVar1;
  void *pvVar2;
  char *pcVar3;
  QMetaTypeInterface *pQVar4;
  bool *in_RSI;
  R_conflict2 *in_RDI;
  long in_FS_OFFSET;
  undefined8 in_stack_00000008;
  char *in_stack_00000010;
  array<const_QtPrivate::QMetaTypeInterface_*,_2UL> types;
  array<const_char_*,_2UL> names;
  array<const_void_*,_2UL> params;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar2 = Invoke::dataHelper<bool>(in_RSI);
  pcVar3 = Invoke::typenameHelper<bool>(in_RSI);
  pQVar4 = Invoke::metaTypeHelper<bool>((bool *)0x1e8df4);
  (in_RDI->parameters)._M_elems[0] = arguments;
  (in_RDI->parameters)._M_elems[1] = pvVar2;
  (in_RDI->typeNames)._M_elems[0] = in_stack_00000010;
  (in_RDI->typeNames)._M_elems[1] = pcVar3;
  local_38 = (undefined4)in_stack_00000008;
  uStack_34 = (undefined4)((ulong)in_stack_00000008 >> 0x20);
  uStack_30 = SUB84(pQVar4,0);
  uStack_2c = (undefined4)((ulong)pQVar4 >> 0x20);
  *(undefined4 *)(in_RDI->metaTypes)._M_elems = local_38;
  *(undefined4 *)((long)(in_RDI->metaTypes)._M_elems + 4) = uStack_34;
  *(undefined4 *)((in_RDI->metaTypes)._M_elems + 1) = uStack_30;
  *(undefined4 *)((long)(in_RDI->metaTypes)._M_elems + 0xc) = uStack_2c;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline auto invokeMethodHelper(QMetaMethodReturnArgument r, const Args &... arguments)
{
    std::array params = { const_cast<const void *>(r.data), Invoke::dataHelper(arguments)... };
    std::array names = { r.name, Invoke::typenameHelper(arguments)... };
    std::array types = { r.metaType, Invoke::metaTypeHelper(arguments)... };
    static_assert(params.size() == types.size());
    static_assert(params.size() == names.size());

    struct R {
        decltype(params) parameters;
        decltype(names) typeNames;
        decltype(types) metaTypes;
        constexpr qsizetype parameterCount() const { return qsizetype(parameters.size()); }
    };
    return R { params, names, types };
}